

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O1

void __thiscall llvm::Triple::Triple(Triple *this,Twine *ArchStr,Twine *VendorStr,Twine *OSStr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  StringRef ArchName;
  StringRef SubArchName;
  StringRef VendorName;
  StringRef OSName;
  Twine *this_00;
  ArchType AVar2;
  SubArchType SVar3;
  VendorType VVar4;
  OSType OVar5;
  ObjectFormatType OVar6;
  NodeKind NVar7;
  NodeKind NVar8;
  Child CVar9;
  Child CVar10;
  NodeKind NVar11;
  Child local_a8;
  uint uStack_a0;
  undefined4 uStack_9c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  Child local_88;
  uint uStack_80;
  undefined4 uStack_7c;
  undefined8 local_78;
  Child local_68;
  uint uStack_60;
  undefined4 uStack_5c;
  NodeKind local_58;
  char cStack_57;
  undefined6 uStack_56;
  Child local_50;
  uint uStack_48;
  undefined4 uStack_44;
  NodeKind local_40;
  char cStack_3f;
  undefined6 uStack_3e;
  Twine *local_38;
  
  NVar8 = ArchStr->LHSKind;
  if (NVar8 == EmptyKind) {
    local_68 = (Child)0x2d;
    local_58 = CharKind;
    cStack_57 = '\x01';
  }
  else if (NVar8 == NullKind) {
    local_58 = NullKind;
    cStack_57 = '\x01';
  }
  else {
    CVar10.twine = ArchStr;
    NVar7 = TwineKind;
    if (ArchStr->RHSKind == EmptyKind) {
      CVar10 = ArchStr->LHS;
      NVar7 = NVar8;
    }
    Twine::Twine((Twine *)&local_68,CVar10,NVar7,(Child)0x2d,CharKind);
  }
  if ((local_58 == NullKind) || (NVar8 = VendorStr->LHSKind, NVar8 == NullKind)) {
    local_78 = CONCAT62(local_78._2_6_,0x100);
  }
  else if (local_58 == EmptyKind) {
    local_78._0_1_ = VendorStr->LHSKind;
    local_78._1_1_ = VendorStr->RHSKind;
    local_78._2_6_ = *(undefined6 *)&VendorStr->field_0x12;
    local_88.decUI = (VendorStr->LHS).decUI;
    local_88._4_4_ = *(undefined4 *)((long)&VendorStr->LHS + 4);
    uStack_80 = (VendorStr->RHS).decUI;
    uStack_7c = *(undefined4 *)((long)&VendorStr->RHS + 4);
  }
  else if (NVar8 == EmptyKind) {
    local_78 = CONCAT62(uStack_56,CONCAT11(cStack_57,local_58));
    local_88.decUI = local_68.decUI;
    local_88._4_4_ = local_68._4_4_;
    uStack_80 = uStack_60;
    uStack_7c = uStack_5c;
  }
  else {
    CVar10 = local_68;
    NVar7 = local_58;
    if (cStack_57 != '\x01') {
      CVar10.twine = (Twine *)&local_68;
      NVar7 = TwineKind;
    }
    CVar9.twine = VendorStr;
    NVar11 = TwineKind;
    if (VendorStr->RHSKind == EmptyKind) {
      CVar9 = VendorStr->LHS;
      NVar11 = NVar8;
    }
    Twine::Twine((Twine *)&local_88,CVar10,NVar7,CVar9,NVar11);
  }
  if ((NodeKind)local_78 == EmptyKind) {
    local_50 = (Child)0x2d;
    local_40 = CharKind;
    cStack_3f = '\x01';
  }
  else if ((NodeKind)local_78 == NullKind) {
    local_40 = NullKind;
    cStack_3f = '\x01';
  }
  else {
    NVar8 = TwineKind;
    if (local_78._1_1_ == '\x01') {
      NVar8 = (NodeKind)local_78;
    }
    CVar10._4_4_ = local_88._4_4_;
    CVar10.decUI = local_88.decUI;
    CVar9.twine = (Twine *)&local_88;
    if (local_78._1_1_ == '\x01') {
      CVar9 = CVar10;
    }
    Twine::Twine((Twine *)&local_50,CVar9,NVar8,(Child)0x2d,CharKind);
  }
  local_38 = OSStr;
  if ((local_40 == NullKind) || (NVar8 = OSStr->LHSKind, NVar8 == NullKind)) {
    local_98._M_allocated_capacity._0_2_ = 0x100;
  }
  else if (local_40 == EmptyKind) {
    local_98._0_1_ = OSStr->LHSKind;
    local_98._1_1_ = OSStr->RHSKind;
    local_98._M_allocated_capacity._2_6_ = *(undefined6 *)&OSStr->field_0x12;
    local_a8.decUI = (OSStr->LHS).decUI;
    local_a8._4_4_ = *(undefined4 *)((long)&OSStr->LHS + 4);
    uStack_a0 = (OSStr->RHS).decUI;
    uStack_9c = *(undefined4 *)((long)&OSStr->RHS + 4);
  }
  else if (NVar8 == EmptyKind) {
    local_98._M_allocated_capacity = CONCAT62(uStack_3e,CONCAT11(cStack_3f,local_40));
    local_a8.decUI = local_50.decUI;
    local_a8._4_4_ = local_50._4_4_;
    uStack_a0 = uStack_48;
    uStack_9c = uStack_44;
  }
  else {
    CVar10 = local_50;
    NVar7 = local_40;
    if (cStack_3f != '\x01') {
      CVar10.twine = (Twine *)&local_50;
      NVar7 = TwineKind;
    }
    CVar9.twine = OSStr;
    NVar11 = TwineKind;
    if (OSStr->RHSKind == EmptyKind) {
      CVar9 = OSStr->LHS;
      NVar11 = NVar8;
    }
    Twine::Twine((Twine *)&local_a8,CVar10,NVar7,CVar9,NVar11);
  }
  Twine::str_abi_cxx11_(&this->Data,(Twine *)&local_a8);
  Twine::str_abi_cxx11_((string *)&local_a8,ArchStr);
  ArchName.Data._4_4_ = local_a8._4_4_;
  ArchName.Data._0_4_ = local_a8.decUI;
  ArchName.Length._0_4_ = uStack_a0;
  ArchName.Length._4_4_ = uStack_9c;
  AVar2 = parseArch(ArchName);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_a8._4_4_,local_a8.decUI) != &local_98) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_a8._4_4_,local_a8.decUI),local_98._M_allocated_capacity + 1);
  }
  this->Arch = AVar2;
  Twine::str_abi_cxx11_((string *)&local_a8,ArchStr);
  SubArchName.Data._4_4_ = local_a8._4_4_;
  SubArchName.Data._0_4_ = local_a8.decUI;
  SubArchName.Length._0_4_ = uStack_a0;
  SubArchName.Length._4_4_ = uStack_9c;
  SVar3 = parseSubArch(SubArchName);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_a8._4_4_,local_a8.decUI) != &local_98) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_a8._4_4_,local_a8.decUI),local_98._M_allocated_capacity + 1);
  }
  this->SubArch = SVar3;
  Twine::str_abi_cxx11_((string *)&local_a8,VendorStr);
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)CONCAT44(local_a8._4_4_,local_a8.decUI);
  VendorName.Data._4_4_ = local_a8._4_4_;
  VendorName.Data._0_4_ = local_a8.decUI;
  VendorName.Length._0_4_ = uStack_a0;
  VendorName.Length._4_4_ = uStack_9c;
  VVar4 = parseVendor(VendorName);
  this_00 = local_38;
  if (paVar1 != &local_98) {
    operator_delete(paVar1,local_98._M_allocated_capacity + 1);
  }
  this->Vendor = VVar4;
  Twine::str_abi_cxx11_((string *)&local_a8,this_00);
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)CONCAT44(local_a8._4_4_,local_a8.decUI);
  OSName.Data._4_4_ = local_a8._4_4_;
  OSName.Data._0_4_ = local_a8.decUI;
  OSName.Length._0_4_ = uStack_a0;
  OSName.Length._4_4_ = uStack_9c;
  OVar5 = parseOS(OSName);
  if (paVar1 != &local_98) {
    operator_delete(paVar1,local_98._M_allocated_capacity + 1);
  }
  this->OS = OVar5;
  this->Environment = UnknownEnvironment;
  this->ObjectFormat = UnknownObjectFormat;
  OVar6 = getDefaultFormat(this);
  this->ObjectFormat = OVar6;
  return;
}

Assistant:

Triple::Triple(const Twine &ArchStr, const Twine &VendorStr, const Twine &OSStr)
    : Data((ArchStr + Twine('-') + VendorStr + Twine('-') + OSStr).str()),
      Arch(parseArch(ArchStr.str())),
      SubArch(parseSubArch(ArchStr.str())),
      Vendor(parseVendor(VendorStr.str())),
      OS(parseOS(OSStr.str())),
      Environment(), ObjectFormat(Triple::UnknownObjectFormat) {
  ObjectFormat = getDefaultFormat(*this);
}